

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void * KINCreate(SUNContext_conflict sunctx)

{
  long in_RDI;
  double dVar1;
  long lVar2;
  sunrealtype uround;
  KINMem kin_mem;
  long *local_8;
  
  if (in_RDI == 0) {
    KINProcessError((KINMem)0x0,0,0xdb,"KINCreate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,"sunctx = NULL illegal.");
    local_8 = (long *)0x0;
  }
  else {
    local_8 = (long *)malloc(0x2a0);
    if (local_8 == (long *)0x0) {
      KINProcessError((KINMem)0x0,0,0xe3,"KINCreate",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                      ,"A memory request failed.");
      local_8 = (long *)0x0;
    }
    else {
      memset(local_8,0,0x2a0);
      *local_8 = in_RDI;
      local_8[1] = 0x3cb0000000000000;
      local_8[2] = 0;
      local_8[3] = 0;
      local_8[0x21] = 0;
      local_8[0x22] = 0;
      local_8[0x23] = 0;
      local_8[0x24] = 0;
      local_8[0x25] = 0;
      local_8[0x26] = 0;
      local_8[0x27] = 0;
      local_8[0x28] = 0;
      local_8[0x29] = 0;
      local_8[0x2a] = 0;
      local_8[0x2b] = 0;
      local_8[0x2e] = 0;
      local_8[0x2f] = 0;
      local_8[0x30] = 0;
      local_8[0x31] = 0;
      local_8[0x32] = 0;
      local_8[0x36] = 0;
      local_8[0x34] = 0;
      local_8[0x35] = 0;
      local_8[0x37] = 0;
      local_8[0x3e] = 0;
      local_8[0x3f] = 0;
      local_8[0x49] = 0;
      local_8[0x2d] = 0x3ff0000000000000;
      *(undefined4 *)((long)local_8 + 0x164) = 0;
      local_8[0x38] = 0;
      local_8[0x39] = 0;
      *(undefined4 *)(local_8 + 0x3a) = 0;
      local_8[0x3b] = 0;
      local_8[0x3c] = 0;
      local_8[0x33] = 0x3ff0000000000000;
      *(undefined4 *)(local_8 + 0x3d) = 0;
      *(undefined4 *)(local_8 + 0xc) = 0;
      *(undefined4 *)(local_8 + 0x2c) = 0;
      local_8[7] = 200;
      *(undefined4 *)(local_8 + 0x18) = 0;
      local_8[8] = 10;
      *(undefined4 *)((long)local_8 + 0x6c) = 0;
      local_8[9] = 5;
      *(undefined4 *)((long)local_8 + 0x74) = 0;
      local_8[10] = 10;
      local_8[0x19] = 0x4000000000000000;
      *(undefined4 *)((long)local_8 + 0x5c) = 0;
      local_8[0x10] = 0;
      dVar1 = sqrt(2.220446049250313e-16);
      local_8[0x11] = (long)dVar1;
      lVar2 = SUNRpowerR(0x3cb0000000000000,0x3fe5555555555556);
      local_8[5] = lVar2;
      lVar2 = SUNRpowerR(0x3cb0000000000000,0x3fd5555555555555);
      local_8[4] = lVar2;
      *(undefined4 *)(local_8 + 0xb) = 1;
      local_8[0x15] = 0x3fb999999999999a;
      local_8[0x17] = 0x4000000000000000;
      local_8[0x16] = 0x3feccccccccccccd;
      *(undefined4 *)(local_8 + 0x53) = 0;
      *(undefined4 *)(local_8 + 0x4f) = 1;
      local_8[0x50] = 0;
      local_8[0x51] = 0x3ee4f8b588e368f1;
      local_8[0x52] = 0x3feccccccccccccd;
      local_8[0x42] = 0x11;
      local_8[0x43] = 0x16;
      local_8[0x40] = 0;
      local_8[0x41] = 0;
    }
  }
  return local_8;
}

Assistant:

void* KINCreate(SUNContext sunctx)
{
  KINMem kin_mem;
  sunrealtype uround;

  /* Test inputs */
  if (sunctx == NULL)
  {
    KINProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSG_NULL_SUNCTX);
    return (NULL);
  }

  kin_mem = NULL;
  kin_mem = (KINMem)malloc(sizeof(struct KINMemRec));
  if (kin_mem == NULL)
  {
    KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
    return (NULL);
  }

  /* Zero out kin_mem */
  memset(kin_mem, 0, sizeof(struct KINMemRec));

  kin_mem->kin_sunctx = sunctx;

  /* set uround (unit roundoff) */

  kin_mem->kin_uround = uround = SUN_UNIT_ROUNDOFF;

  /* set default values for solver optional inputs */

  kin_mem->kin_func             = NULL;
  kin_mem->kin_user_data        = NULL;
  kin_mem->kin_uu               = NULL;
  kin_mem->kin_unew             = NULL;
  kin_mem->kin_fval             = NULL;
  kin_mem->kin_gval             = NULL;
  kin_mem->kin_uscale           = NULL;
  kin_mem->kin_fscale           = NULL;
  kin_mem->kin_pp               = NULL;
  kin_mem->kin_constraints      = NULL;
  kin_mem->kin_vtemp1           = NULL;
  kin_mem->kin_vtemp2           = NULL;
  kin_mem->kin_vtemp3           = NULL;
  kin_mem->kin_fold_aa          = NULL;
  kin_mem->kin_gold_aa          = NULL;
  kin_mem->kin_df_aa            = NULL;
  kin_mem->kin_dg_aa            = NULL;
  kin_mem->kin_q_aa             = NULL;
  kin_mem->kin_T_aa             = NULL;
  kin_mem->kin_gamma_aa         = NULL;
  kin_mem->kin_R_aa             = NULL;
  kin_mem->kin_ipt_map          = NULL;
  kin_mem->kin_cv               = NULL;
  kin_mem->kin_Xv               = NULL;
  kin_mem->kin_lmem             = NULL;
  kin_mem->kin_beta             = ONE;
  kin_mem->kin_damping          = SUNFALSE;
  kin_mem->kin_m_aa             = 0;
  kin_mem->kin_delay_aa         = 0;
  kin_mem->kin_orth_aa          = KIN_ORTH_MGS;
  kin_mem->kin_qr_func          = NULL;
  kin_mem->kin_qr_data          = NULL;
  kin_mem->kin_beta_aa          = ONE;
  kin_mem->kin_damping_aa       = SUNFALSE;
  kin_mem->kin_constraintsSet   = SUNFALSE;
  kin_mem->kin_ret_newest       = SUNFALSE;
  kin_mem->kin_mxiter           = MXITER_DEFAULT;
  kin_mem->kin_noInitSetup      = SUNFALSE;
  kin_mem->kin_msbset           = MSBSET_DEFAULT;
  kin_mem->kin_noResMon         = SUNFALSE;
  kin_mem->kin_msbset_sub       = MSBSET_SUB_DEFAULT;
  kin_mem->kin_update_fnorm_sub = SUNFALSE;
  kin_mem->kin_mxnbcf           = MXNBCF_DEFAULT;
  kin_mem->kin_sthrsh           = TWO;
  kin_mem->kin_noMinEps         = SUNFALSE;
  kin_mem->kin_mxnstepin        = ZERO;
  kin_mem->kin_sqrt_relfunc     = SUNRsqrt(uround);
  kin_mem->kin_scsteptol        = SUNRpowerR(uround, TWOTHIRDS);
  kin_mem->kin_fnormtol         = SUNRpowerR(uround, ONETHIRD);
  kin_mem->kin_etaflag          = KIN_ETACHOICE1;
  kin_mem->kin_eta              = POINT1; /* default for KIN_ETACONSTANT */
  kin_mem->kin_eta_alpha        = TWO;    /* default for KIN_ETACHOICE2  */
  kin_mem->kin_eta_gamma        = POINT9; /* default for KIN_ETACHOICE2  */
  kin_mem->kin_MallocDone       = SUNFALSE;
  kin_mem->kin_eval_omega       = SUNTRUE;
  kin_mem->kin_omega            = ZERO; /* default to using min/max    */
  kin_mem->kin_omega_min        = OMEGA_MIN;
  kin_mem->kin_omega_max        = OMEGA_MAX;

  /* initialize lrw and liw */

  kin_mem->kin_lrw = 17;
  kin_mem->kin_liw = 22;

  /* NOTE: needed since KINInit could be called after KINSetConstraints */

  kin_mem->kin_lrw1 = 0;
  kin_mem->kin_liw1 = 0;

  return ((void*)kin_mem);
}